

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_TestShell::
~TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_TestShell
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNewArray)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char;
    CHECK(cpputestHasCrashed);
    delete memory;

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}